

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourceCode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sourceCode_create
          (sysbvm_context_t *context,sysbvm_tuple_t text,sysbvm_tuple_t directory,
          sysbvm_tuple_t name,sysbvm_tuple_t language)

{
  int iVar1;
  sysbvm_object_tuple_t *psVar2;
  size_t value;
  sysbvm_tuple_t sVar3;
  sysbvm_sourceCode_t *result;
  sysbvm_tuple_t language_local;
  sysbvm_tuple_t name_local;
  sysbvm_tuple_t directory_local;
  sysbvm_tuple_t text_local;
  sysbvm_context_t *context_local;
  
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).sourceCodeType,7);
  (psVar2->field_1).pointers[0] = text;
  psVar2[1].header.field_0.typePointer = directory;
  psVar2[1].header.identityHashAndFlags = (int)name;
  psVar2[1].header.objectSize = (int)(name >> 0x20);
  psVar2[1].field_1.pointers[0] = language;
  iVar1 = 0xf;
  if (directory != 0) {
    iVar1 = 0x1f;
  }
  psVar2[2].header.field_0 = (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(long)iVar1;
  value = sysbvm_tuple_getSizeInBytes((psVar2->field_1).pointers[0]);
  sVar3 = sysbvm_tuple_size_encode(context,value);
  psVar2[2].header.identityHashAndFlags = (int)sVar3;
  psVar2[2].header.objectSize = (int)(sVar3 >> 0x20);
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourceCode_create(sysbvm_context_t *context, sysbvm_tuple_t text, sysbvm_tuple_t directory, sysbvm_tuple_t name, sysbvm_tuple_t language)
{
    sysbvm_sourceCode_t *result = (sysbvm_sourceCode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.sourceCodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_sourceCode_t));
    result->text = text;
    result->directory = directory;
    result->name = name;
    result->language = language;
    result->isInFile = directory ? SYSBVM_TRUE_TUPLE : SYSBVM_FALSE_TUPLE;
    result->textSize = sysbvm_tuple_size_encode(context, sysbvm_tuple_getSizeInBytes(result->text));
    return (sysbvm_tuple_t)result;
}